

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O0

size_t __thiscall wasm::DFA::anon_unknown_0::Partitions::Set::split(Set *this)

{
  ulong uVar1;
  ulong uVar2;
  Partitions *pPVar3;
  reference pvVar4;
  size_type local_40;
  size_t i;
  size_t newIndex;
  size_t pivot;
  size_t end;
  size_t begin;
  Set *this_local;
  
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->partitions->beginnings,this->index);
  local_40 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->partitions->endings,this->index);
  uVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->partitions->pivots,this->index);
  uVar2 = *pvVar4;
  if (uVar2 == local_40) {
    this_local = (Set *)0x0;
  }
  else if (uVar2 == uVar1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->partitions->pivots,this->index);
    *pvVar4 = local_40;
    this_local = (Set *)0x0;
  }
  else {
    this_local = (Set *)this->partitions->sets;
    this->partitions->sets = (size_t)((long)&this_local->partitions + 1);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->partitions->beginnings,(size_type)this_local);
    *pvVar4 = local_40;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->partitions->pivots,(size_type)this_local);
    *pvVar4 = local_40;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->partitions->endings,(size_type)this_local);
    *pvVar4 = uVar2;
    for (; local_40 < uVar2; local_40 = local_40 + 1) {
      pPVar3 = this->partitions;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->partitions->elements,local_40);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&pPVar3->setIndices,*pvVar4);
      *pvVar4 = (value_type)this_local;
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->partitions->beginnings,this->index);
    *pvVar4 = uVar2;
  }
  return (size_t)this_local;
}

Assistant:

size_t split() {
      size_t begin = partitions.beginnings[index];
      size_t end = partitions.endings[index];
      size_t pivot = partitions.pivots[index];
      if (pivot == begin) {
        // No elements marked, so there is nothing to do.
        return 0;
      }
      if (pivot == end) {
        // All elements were marked, so just unmark them.
        partitions.pivots[index] = begin;
        return 0;
      }
      // Create a new set covering the marked region.
      size_t newIndex = partitions.sets++;
      partitions.beginnings[newIndex] = begin;
      partitions.pivots[newIndex] = begin;
      partitions.endings[newIndex] = pivot;
      for (size_t i = begin; i < pivot; ++i) {
        partitions.setIndices[partitions.elements[i]] = newIndex;
      }
      // Update the old set. The end and pivot are already correct.
      partitions.beginnings[index] = pivot;
      return newIndex;
    }